

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall yy::parser::error(parser *this,syntax_error *yyexc)

{
  char *__s;
  allocator<char> local_39;
  string local_38 [32];
  syntax_error *local_18;
  syntax_error *yyexc_local;
  parser *this_local;
  
  local_18 = yyexc;
  yyexc_local = (syntax_error *)this;
  __s = (char *)(**(code **)(*(long *)yyexc + 0x10))();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  (*this->_vptr_parser[3])(this,&yyexc->location,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void
  parser::error (const syntax_error& yyexc)
  {
    error (yyexc.location, yyexc.what ());
  }